

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::disconnectInterface(CommonCore *this,ActionMessage *command)

{
  BasicHandleInfo *pBVar1;
  FederateState *this_00;
  
  pBVar1 = HandleManager::getHandleInfo
                     (&this->loopHandles,(InterfaceHandle)(command->source_handle).hid);
  if ((pBVar1 != (BasicHandleInfo *)0x0) && ((pBVar1->flags >> 0xc & 1) == 0)) {
    pBVar1->flags = pBVar1->flags | 0x1000;
    if ((pBVar1->handle).fed_id.gid == (this->filterFedID)._M_i.gid) {
      if (this->filterFed != (FilterFederate *)0x0) {
        FilterFederate::handleMessage(this->filterFed,command);
      }
    }
    else if ((pBVar1->handle).fed_id.gid == (this->translatorFedID)._M_i.gid) {
      if (this->translatorFed != (TranslatorFederate *)0x0) {
        TranslatorFederate::handleMessage(this->translatorFed,command);
      }
    }
    else if (pBVar1->handleType != FILTER) {
      this_00 = getFederateCore(this,(GlobalFederateId)(command->source_id).gid);
      if (this_00 != (FederateState *)0x0) {
        FederateState::addAction(this_00,command);
      }
    }
    if (-1 < (short)pBVar1->flags) {
      (*(this->super_Core)._vptr_Core[0x6b])(this,0,command);
      return;
    }
  }
  return;
}

Assistant:

void CommonCore::disconnectInterface(ActionMessage& command)
{
    auto* handleInfo = loopHandles.getHandleInfo(command.source_handle);
    if (handleInfo == nullptr) {
        return;
    }
    if (checkActionFlag(*handleInfo, disconnected_flag)) {
        return;
    }
    setActionFlag(*handleInfo, disconnected_flag);
    if (handleInfo->getFederateId() == filterFedID.load()) {
        if (filterFed != nullptr) {
            filterFed->handleMessage(command);
        }
    } else if (handleInfo->getFederateId() == translatorFedID.load()) {
        if (translatorFed != nullptr) {
            translatorFed->handleMessage(command);
        }
    } else {
        if (handleInfo->handleType != InterfaceType::FILTER) {
            auto* fed = getFederateCore(command.source_id);
            if (fed != nullptr) {
                fed->addAction(command);
            }
        }
    }

    if (!checkActionFlag(*handleInfo, nameless_interface_flag)) {
        transmit(parent_route_id, command);
    }
}